

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrency.h
# Opt level: O0

void __thiscall
skiwi::
combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
::clear(combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
        *this)

{
  _Node *p_Var1;
  _Node *_NextNode;
  _Node *_CurrentNode;
  size_t _Index;
  combinable<std::vector<skiwi::(anonymous_namespace)::compiler_data_memento,_std::allocator<skiwi::(anonymous_namespace)::compiler_data_memento>_>_>
  *this_local;
  
  for (_CurrentNode = (_Node *)0x0; _CurrentNode < (_Node *)this->_M_size;
      _CurrentNode = (_Node *)((long)&_CurrentNode->_M_key + 1)) {
    p_Var1 = std::atomic::operator_cast_to__Node_((atomic *)(this->_M_buckets + (long)_CurrentNode))
    ;
    while (_NextNode = p_Var1, _NextNode != (_Node *)0x0) {
      p_Var1 = _NextNode->_M_chain;
      if (_NextNode != (_Node *)0x0) {
        _Node::~_Node(_NextNode);
        operator_delete(_NextNode);
      }
    }
  }
  memset(this->_M_buckets,0,this->_M_size << 3);
  return;
}

Assistant:

void clear()
      {
      for (size_t _Index = 0; _Index < _M_size; ++_Index)
        {
        _Node* _CurrentNode = _M_buckets[_Index];
        while (_CurrentNode != nullptr)
          {
          _Node* _NextNode = _CurrentNode->_M_chain;
          delete _CurrentNode;
          _CurrentNode = _NextNode;
          }
        }
      memset((void*)_M_buckets, 0, _M_size * sizeof _M_buckets[0]);
      }